

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O2

Vec_Ptr_t * Cec_ManPatCollectPatterns(Cec_ManPat_t *pMan,int nInputs,int nWordsInit)

{
  int iVar1;
  Vec_Int_t *p;
  int iVar2;
  int Entry;
  int iVar3;
  abctime aVar4;
  Vec_Ptr_t *vInfo;
  Vec_Ptr_t *pVVar5;
  void *pvVar6;
  void *pvVar7;
  abctime aVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  uint iBit;
  uint local_64;
  uint local_60;
  
  p = pMan->vPattern1;
  iVar1 = pMan->iStart;
  uVar9 = nWordsInit << 5;
  aVar4 = Abc_Clock();
  vInfo = Vec_PtrAllocSimInfo(nInputs,nWordsInit);
  local_60 = 0;
  Gia_ManRandomInfo(vInfo,0,0,nWordsInit);
  pVVar5 = Vec_PtrAllocSimInfo(nInputs,nWordsInit);
  Vec_PtrCleanSimInfo(pVVar5,0,nWordsInit);
  local_64 = 0xffffffff;
  uVar10 = uVar9;
  iVar11 = nWordsInit;
  do {
    do {
      if (pMan->vStorage->nSize <= pMan->iStart) {
        Vec_PtrFree(pVVar5);
        pvVar6 = Vec_PtrEntry(vInfo,1);
        pVVar5 = vInfo;
        pvVar7 = Vec_PtrEntry(vInfo,0);
        iVar11 = (int)pVVar5;
        uVar13 = (ulong)((long)pvVar6 - (long)pvVar7) >> 2;
        pMan->nSeries =
             (int)((long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff) /
                  (long)nWordsInit);
        aVar8 = Abc_Clock();
        pMan->timePack = pMan->timePack + (aVar8 - aVar4);
        aVar8 = Abc_Clock();
        pMan->timeTotal = pMan->timeTotal + (aVar8 - aVar4);
        pMan->iStart = iVar1;
        if (pMan->fVerbose != 0) {
          Abc_Print(iVar11,"Total = %5d. Max used = %5d. Full = %5d. Series = %d. ",(ulong)local_60,
                    (ulong)local_64,(ulong)uVar9,(ulong)(uint)pMan->nSeries);
          Abc_Print(iVar11,"%s =","Time");
          aVar8 = Abc_Clock();
          Abc_Print(iVar11,"%9.2f sec\n",(double)(aVar8 - aVar4) / 1000000.0);
          Cec_ManPatPrintStats(pMan);
        }
        return vInfo;
      }
      p->nSize = 0;
      iVar2 = Cec_ManPatRestoreNum(pMan);
      Entry = Cec_ManPatRestoreNum(pMan);
      Vec_IntPush(p,Entry);
      for (iVar12 = 1; iVar12 < iVar2; iVar12 = iVar12 + 1) {
        iVar3 = Cec_ManPatRestoreNum(pMan);
        Entry = Entry + iVar3;
        Vec_IntPush(p,Entry);
      }
      if (p->nSize != iVar2) {
        __assert_fail("Vec_IntSize(vPat) == Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecPat.c"
                      ,0x7d,"void Cec_ManPatRestore(Cec_ManPat_t *, Vec_Int_t *)");
      }
      local_60 = local_60 + 1;
      iBit = 1;
      while( true ) {
        if ((int)uVar10 <= (int)iBit) break;
        iVar12 = Cec_ManPatCollectTry(vInfo,pVVar5,iBit,p->pArray,p->nSize);
        if (iVar12 != 0) break;
        iBit = iBit + 1 + (uint)((int)(iBit + 1) % (int)uVar9 == 0);
      }
      if ((int)local_64 <= (int)iBit) {
        local_64 = iBit;
      }
    } while (iBit != uVar10 - 1);
    Vec_PtrReallocSimInfo(vInfo);
    iVar12 = iVar11 * 2;
    Gia_ManRandomInfo(vInfo,0,iVar11,iVar12);
    Vec_PtrReallocSimInfo(pVVar5);
    Vec_PtrCleanSimInfo(pVVar5,iVar11,iVar12);
    uVar10 = uVar10 * 2;
    iVar11 = iVar12;
  } while( true );
}

Assistant:

Vec_Ptr_t * Cec_ManPatCollectPatterns( Cec_ManPat_t *  pMan, int nInputs, int nWordsInit )
{
    Vec_Int_t * vPat = pMan->vPattern1;
    Vec_Ptr_t * vInfo, * vPres;
    int k, kMax = -1, nPatterns = 0;
    int iStartOld = pMan->iStart;
    int nWords = nWordsInit;
    int nBits = 32 * nWords;
    abctime clk = Abc_Clock();
    vInfo = Vec_PtrAllocSimInfo( nInputs, nWords );
    Gia_ManRandomInfo( vInfo, 0, 0, nWords );
    vPres = Vec_PtrAllocSimInfo( nInputs, nWords );
    Vec_PtrCleanSimInfo( vPres, 0, nWords );
    while ( pMan->iStart < Vec_StrSize(pMan->vStorage) )
    {
        nPatterns++;
        Cec_ManPatRestore( pMan, vPat );
        for ( k = 1; k < nBits; k++, k += ((k % (32 * nWordsInit)) == 0) )
            if ( Cec_ManPatCollectTry( vInfo, vPres, k, (int *)Vec_IntArray(vPat), Vec_IntSize(vPat) ) )
                break;
        kMax = Abc_MaxInt( kMax, k );
        if ( k == nBits-1 )
        {
            Vec_PtrReallocSimInfo( vInfo );
            Gia_ManRandomInfo( vInfo, 0, nWords, 2*nWords );
            Vec_PtrReallocSimInfo( vPres );
            Vec_PtrCleanSimInfo( vPres, nWords, 2*nWords );
            nWords *= 2;
            nBits *= 2;
        }
    }
    Vec_PtrFree( vPres );
    pMan->nSeries = Vec_PtrReadWordsSimInfo(vInfo) / nWordsInit;
    pMan->timePack += Abc_Clock() - clk;
    pMan->timeTotal += Abc_Clock() - clk;
    pMan->iStart = iStartOld;
    if ( pMan->fVerbose )
    {
        Abc_Print( 1, "Total = %5d. Max used = %5d. Full = %5d. Series = %d. ", 
            nPatterns, kMax, nWordsInit*32, pMan->nSeries );
        ABC_PRT( "Time", Abc_Clock() - clk );
        Cec_ManPatPrintStats( pMan );
    }
    return vInfo;
}